

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::addMoleculeStamp(SimInfo *this,MoleculeStamp *molStamp,int nmol)

{
  int id;
  size_type sVar1;
  reference ppMVar2;
  undefined4 in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  int curStampId;
  vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_> *this_00;
  value_type *in_stack_ffffffffffffffc8;
  vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
  *in_stack_ffffffffffffffd0;
  value_type_conflict1 *in_stack_ffffffffffffffe0;
  const_iterator __position;
  
  __position._M_current = (int *)in_RDI;
  sVar1 = std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::size
                    ((vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_> *)
                     (in_RDI + 0x1e));
  id = (int)sVar1;
  std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::push_back
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = (vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_> *)
            (in_RDI + 0x1e);
  sVar1 = std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::size
                    ((vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_> *)
                     (in_RDI + 0x1e));
  ppMVar2 = std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::
            operator[](this_00,sVar1 - 1);
  MoleculeStamp::setIdent(*ppMVar2,id);
  std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this_00);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            (in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::insert
            (in_RSI,__position,CONCAT44(in_EDX,id),in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void SimInfo::addMoleculeStamp(MoleculeStamp* molStamp, int nmol) {
    int curStampId;

    // index from 0
    curStampId = moleculeStamps_.size();

    moleculeStamps_.push_back(molStamp);
    moleculeStamps_[moleculeStamps_.size() - 1]->setIdent(curStampId);
    molStampIds_.insert(molStampIds_.end(), nmol, curStampId);
  }